

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmWhile(ExpressionContext *ctx,VmModule *module,ExprWhile *node)

{
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmValue *pVVar1;
  LoopInfo local_40;
  
  block = anon_unknown.dwarf_11cad6::CreateBlock(module,(node->super_ExprBase).source,"while_cond");
  block_00 = anon_unknown.dwarf_11cad6::CreateBlock
                       (module,(node->super_ExprBase).source,"while_body");
  block_01 = anon_unknown.dwarf_11cad6::CreateBlock
                       (module,(node->super_ExprBase).source,"while_exit");
  local_40.breakBlock = block_01;
  local_40.continueBlock = block;
  SmallArray<VmModule::LoopInfo,_32U>::push_back(&module->loopInfo,&local_40);
  anon_unknown.dwarf_11cad6::CreateJump(module,(node->super_ExprBase).source,&block->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  pVVar1 = CompileVm(ctx,module,node->condition);
  anon_unknown.dwarf_11cad6::CreateJumpNotZero
            (module,(node->super_ExprBase).source,pVVar1,&block_00->super_VmValue,
             &block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  CompileVm(ctx,module,node->body);
  anon_unknown.dwarf_11cad6::CreateJump(module,(node->super_ExprBase).source,&block->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back(&module->loopInfo);
  pVVar1 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmWhile(ExpressionContext &ctx, VmModule *module, ExprWhile *node)
{
	VmBlock *conditionBlock = CreateBlock(module, node->source, "while_cond");
	VmBlock *bodyBlock = CreateBlock(module, node->source, "while_body");
	VmBlock *exitBlock = CreateBlock(module, node->source, "while_exit");

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, conditionBlock));

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(conditionBlock);
	module->currentBlock = conditionBlock;

	VmValue* condition = CompileVm(ctx, module, node->condition);

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	CompileVm(ctx, module, node->body);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}